

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# screen.cpp
# Opt level: O1

string * __thiscall
ftxui::Screen::ResetPosition_abi_cxx11_(string *__return_storage_ptr__,Screen *this,bool clear)

{
  undefined7 in_register_00000011;
  int iVar1;
  stringstream ss;
  stringstream asStack_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(asStack_1b8);
  if ((int)CONCAT71(in_register_00000011,clear) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\r",1);
    if (1 < this->dimy_) {
      iVar1 = 1;
      do {
        std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\x1b[1A",4);
        iVar1 = iVar1 + 1;
      } while (iVar1 < this->dimy_);
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\r",1);
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\x1b[2K",4);
    if (1 < this->dimy_) {
      iVar1 = 1;
      do {
        std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\x1b[1A",4);
        std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\x1b[2K",4);
        iVar1 = iVar1 + 1;
      } while (iVar1 < this->dimy_);
    }
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(asStack_1b8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string Screen::ResetPosition(bool clear) const {
  std::stringstream ss;
  if (clear) {
    ss << "\r";       // MOVE_LEFT;
    ss << "\x1b[2K";  // CLEAR_SCREEN;
    for (int y = 1; y < dimy_; ++y) {
      ss << "\x1B[1A";  // MOVE_UP;
      ss << "\x1B[2K";  // CLEAR_LINE;
    }
  } else {
    ss << "\r";  // MOVE_LEFT;
    for (int y = 1; y < dimy_; ++y) {
      ss << "\x1B[1A";  // MOVE_UP;
    }
  }
  return ss.str();
}